

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithBooleanParameter_TestShell::
~TEST_MockExpectedCall_callWithBooleanParameter_TestShell
          (TEST_MockExpectedCall_callWithBooleanParameter_TestShell *this)

{
  TEST_MockExpectedCall_callWithBooleanParameter_TestShell *this_local;
  
  ~TEST_MockExpectedCall_callWithBooleanParameter_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithBooleanParameter)
{
    const SimpleString paramName = "paramName";
    bool value = true;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("bool", call->getInputParameterType(paramName).asCharString());
    CHECK_EQUAL(value, call->getInputParameter(paramName).getBoolValue());
    CHECK(call->hasInputParameterWithName(paramName));
    STRCMP_CONTAINS("funcName -> bool paramName: <true>", call->callToString().asCharString());
}